

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O1

void do_cmd_knowledge_monsters(char *name,wchar_t row)

{
  bool bVar1;
  group_funcs g_funcs;
  monster_race *pmVar2;
  monster_race *pmVar3;
  ui_monster_category *puVar4;
  wchar_t wVar5;
  join_t *pjVar6;
  _Bool _Var7;
  wchar_t o_count;
  int *obj_list;
  ulong uVar8;
  long lVar9;
  wchar_t wVar10;
  ulong uVar11;
  wchar_t wVar12;
  ulong uVar13;
  bool bVar14;
  group_funcs r_funcs;
  undefined4 uStack_34;
  
  wVar5 = n_monster_group;
  o_count = count_known_monsters();
  default_join = (join_t *)mem_zalloc((long)o_count * 8);
  obj_list = (int *)mem_zalloc((long)o_count << 2);
  if (z_info->r_max != 0) {
    uVar13 = 0;
    wVar10 = L'\0';
    do {
      pmVar3 = r_info;
      if (((l_list[uVar13].all_known != false) || (l_list[uVar13].sights != 0)) &&
         (r_info[uVar13].name != (char *)0x0)) {
        wVar12 = (wchar_t)uVar13;
        if (n_monster_group < L'\x02') {
          uVar8 = (ulong)(uint)(n_monster_group + L'\xffffffff');
          bVar14 = false;
        }
        else {
          pmVar2 = r_info + uVar13;
          lVar9 = 0;
          bVar14 = false;
          do {
            puVar4 = monster_group;
            if (monster_group[lVar9].n_inc_bases == L'\0') {
              bVar1 = false;
            }
            else {
              uVar8 = (ulong)monster_group[lVar9].n_inc_bases;
              bVar1 = 0 < (long)uVar8;
              if (0 < (long)uVar8) {
                uVar11 = 0;
                do {
                  if (pmVar3[uVar13].base == monster_group[lVar9].inc_bases[uVar11]) {
                    if (o_count <= wVar10) {
                      __assert_fail("ind < m_count",
                                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-knowledge.c"
                                    ,0x53f,"void do_cmd_knowledge_monsters(const char *, int)");
                    }
                    obj_list[wVar10] = wVar10;
                    pjVar6 = default_join;
                    default_join[wVar10].oid = wVar12;
                    pjVar6[wVar10].gid = (wchar_t)lVar9;
                    wVar10 = wVar10 + L'\x01';
                    bVar14 = true;
                    bVar1 = true;
                    goto LAB_001d76ae;
                  }
                  uVar11 = uVar11 + 1;
                } while (uVar8 != uVar11);
                bVar1 = uVar11 < uVar8;
              }
            }
LAB_001d76ae:
            if ((!bVar1) &&
               (_Var7 = flag_is_inter(pmVar2->flags,puVar4[lVar9].inc_flags,0xb), _Var7)) {
              if (o_count <= wVar10) {
                __assert_fail("ind < m_count",
                              "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-knowledge.c"
                              ,0x54c,"void do_cmd_knowledge_monsters(const char *, int)");
              }
              obj_list[wVar10] = wVar10;
              pjVar6 = default_join;
              default_join[wVar10].oid = wVar12;
              pjVar6[wVar10].gid = (wchar_t)lVar9;
              wVar10 = wVar10 + L'\x01';
              bVar14 = true;
            }
            lVar9 = lVar9 + 1;
            uVar8 = (long)n_monster_group - 1;
          } while (lVar9 < (long)uVar8);
        }
        if (!bVar14) {
          if (o_count <= wVar10) {
            __assert_fail("ind < m_count",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-knowledge.c"
                          ,0x556,"void do_cmd_knowledge_monsters(const char *, int)");
          }
          obj_list[wVar10] = wVar10;
          pjVar6 = default_join;
          default_join[wVar10].oid = wVar12;
          pjVar6[wVar10].gid = (wchar_t)uVar8;
          wVar10 = wVar10 + L'\x01';
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < z_info->r_max);
  }
  uVar13 = CONCAT44(uStack_34,wVar5) & 0xffffff00ffffffff;
  g_funcs.gcomp = m_cmp_race;
  g_funcs.name = race_name;
  g_funcs.group = default_group_id;
  g_funcs.summary = mon_summary;
  g_funcs.maxnum = (int)uVar13;
  g_funcs.easy_know = (_Bool)(char)(uVar13 >> 0x20);
  g_funcs._37_3_ = (int3)(uVar13 >> 0x28);
  display_knowledge("monsters",obj_list,o_count,g_funcs,
                    (member_funcs)
                    ZEXT4056(CONCAT832(recall_prompt,
                                       CONCAT824(m_xattr,CONCAT816(m_xchar,CONCAT88(mon_lore,
                                                  display_monster))))),
                    "                   Sym  Kills");
  mem_free(default_join);
  mem_free(obj_list);
  return;
}

Assistant:

static void do_cmd_knowledge_monsters(const char *name, int row)
{
	group_funcs r_funcs = {race_name, m_cmp_race, default_group_id,
		mon_summary, n_monster_group, false };

	member_funcs m_funcs = {display_monster, mon_lore, m_xchar, m_xattr,
		recall_prompt, 0, 0};

	int *monsters;
	int m_count = count_known_monsters(), i, ind;

	default_join = mem_zalloc(m_count * sizeof(join_t));
	monsters = mem_zalloc(m_count * sizeof(int));

	ind = 0;
	for (i = 0; i < z_info->r_max; ++i) {
		struct monster_race *race = &r_info[i];
		bool classified = false;
		int j;

		if (!l_list[i].all_known && !l_list[i].sights) {
			continue;
		}
		if (!race->name) continue;

		for (j = 0; j < n_monster_group - 1; ++j) {
			bool has_base = false;

			if (monster_group[j].n_inc_bases) {
				int k;

				for (k = 0; k < monster_group[j].n_inc_bases;
						++k) {
					if (race->base == monster_group[j].inc_bases[k]) {
						assert(ind < m_count);
						monsters[ind] = ind;
						default_join[ind].oid = i;
						default_join[ind].gid = j;
						++ind;
						has_base = true;
						classified = true;
						break;
					}
				}
			}
			if (!has_base && rf_is_inter(race->flags,
					monster_group[j].inc_flags)) {
				assert(ind < m_count);
				monsters[ind] = ind;
				default_join[ind].oid = i;
				default_join[ind].gid = j;
				++ind;
				classified = true;
			}
		}

		if (!classified) {
			assert(ind < m_count);
			monsters[ind] = ind;
			default_join[ind].oid = i;
			default_join[ind].gid = n_monster_group - 1;
			++ind;
		}
	}

	display_knowledge("monsters", monsters, m_count, r_funcs, m_funcs,
			"                   Sym  Kills");
	mem_free(default_join);
	mem_free(monsters);
}